

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADRender.cpp
# Opt level: O2

void adaptive_distributed_render_scene
               (Scene *scene,double HalfWidth,double HalfHeight,int nx,int ny,int nxSub,int nySub,
               double Variance,char *PicFileName)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined6 uVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int jSub;
  int iVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  char cVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  char cVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  char cVar22;
  undefined1 uVar23;
  undefined1 in_XMM0_Bi;
  undefined1 in_XMM0_Bj;
  undefined1 in_XMM0_Bk;
  undefined1 in_XMM0_Bl;
  undefined1 in_XMM0_Bm;
  undefined1 in_XMM0_Bn;
  undefined1 in_XMM0_Bo;
  undefined1 in_XMM0_Bp;
  double dVar24;
  undefined1 auVar25 [16];
  Ray ray;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  long *local_160;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  undefined1 local_138 [24];
  double local_120;
  undefined1 local_118 [16];
  double local_108;
  double local_100;
  double local_f8;
  ulong local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  Color local_80;
  char *local_68;
  Ray local_60;
  
  local_118[8] = in_XMM0_Bi;
  local_118._0_8_ = HalfWidth;
  local_118[9] = in_XMM0_Bj;
  local_118[10] = in_XMM0_Bk;
  local_118[0xb] = in_XMM0_Bl;
  local_118[0xc] = in_XMM0_Bm;
  local_118[0xd] = in_XMM0_Bn;
  local_118[0xe] = in_XMM0_Bo;
  local_118[0xf] = in_XMM0_Bp;
  uVar8 = CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi)));
  uVar5 = CONCAT15(in_XMM0_Bn,CONCAT14(in_XMM0_Bm,uVar8));
  uVar7 = CONCAT17(in_XMM0_Bp,CONCAT16(in_XMM0_Bo,uVar5));
  local_b8._0_8_ = (HalfWidth + HalfWidth) / (double)nx;
  local_b8._8_8_ = uVar7;
  local_120 = (HalfHeight + HalfHeight) / (double)ny;
  local_a8._8_2_ = CONCAT11(in_XMM0_Bj,in_XMM0_Bi);
  local_a8._0_8_ = (double)local_b8._0_8_ / (double)nxSub;
  local_a8._10_2_ = (short)((uint)uVar8 >> 0x10);
  local_a8._12_2_ = (short)((uint6)uVar5 >> 0x20);
  local_a8._14_2_ = (short)((ulong)uVar7 >> 0x30);
  local_e8 = local_120 / (double)nySub;
  local_140 = ny;
  local_13c = nx;
  local_f8 = Variance;
  local_68 = PicFileName;
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&local_160,(int *)&local_68,&local_13c);
  local_118._0_8_ = local_118._0_8_ ^ 0x8000000000000000;
  local_118[0xf] = local_118[0xf] ^ 0x80;
  if (nySub < 1) {
    nySub = 0;
  }
  local_148 = nxSub;
  if (nxSub < 1) {
    local_148 = 0;
  }
  local_150 = nySub * local_148;
  iVar12 = 0;
  local_108 = local_120 * -0.5;
  uVar13 = SUB81(local_108,0);
  uVar14 = (undefined1)((ulong)local_108 >> 8);
  uVar15 = (undefined1)((ulong)local_108 >> 0x10);
  uVar17 = (undefined1)((ulong)local_108 >> 0x18);
  uVar18 = (undefined1)((ulong)local_108 >> 0x20);
  uVar20 = (undefined1)((ulong)local_108 >> 0x28);
  uVar21 = (undefined1)((ulong)local_108 >> 0x30);
  uVar23 = (undefined1)((ulong)local_108 >> 0x38);
  local_100 = (double)local_b8._0_8_ * -0.5;
  local_178 = HalfHeight;
  do {
    if (local_140 <= iVar12) {
      if (local_160 != (long *)0x0) {
        (**(code **)(*local_160 + 8))();
      }
      return;
    }
    local_e0 = (double)CONCAT17(uVar23,CONCAT16(uVar21,CONCAT15(uVar20,CONCAT14(uVar18,CONCAT13(
                                                  uVar17,CONCAT12(uVar15,CONCAT11(uVar14,uVar13)))))
                                               )) + local_178;
    iVar11 = 0;
    local_170 = local_118._0_8_;
    local_14c = iVar12;
    while( true ) {
      if (local_13c <= iVar11) break;
      local_d8 = local_100 + local_170;
      TotalPixels = TotalPixels + 1;
      local_138._9_7_ = 0;
      local_138._0_9_ = (unkuint9)0;
      local_f0 = 0;
      local_180 = 0.0;
      local_168 = 0.0;
      local_154 = iVar11;
      do {
        local_f0 = (ulong)(uint)((int)local_f0 + local_150);
        iVar11 = 0;
        while( true ) {
          if (iVar11 == local_148) break;
          local_d0 = (double)iVar11;
          iVar12 = 0;
          local_144 = iVar11;
          while( true ) {
            if (nySub == iVar12) break;
            dVar9 = rnd();
            local_c0 = (dVar9 + local_d0) * (double)local_a8._0_8_ + local_d8;
            local_c8 = (double)iVar12;
            dVar9 = rnd();
            Scene::camera(scene,local_c0,(local_c8 + dVar9) * local_e8 + local_e0,&local_60);
            Scene::trace(&local_80,scene,&Grayzer::Medium::air,1.0,&local_60);
            local_180 = local_180 + local_80.x;
            dVar9 = local_80.y;
            dVar24 = local_80.z;
            local_138._8_8_ = (double)local_138._8_8_ + dVar24;
            local_138._0_8_ = (double)local_138._0_8_ + dVar9;
            local_168 = local_168 + dVar24 * dVar24 + local_80.x * local_80.x + dVar9 * dVar9;
            iVar12 = iVar12 + 1;
          }
          iVar11 = local_144 + 1;
          iVar12 = local_14c;
        }
        iVar11 = (int)local_f0;
        dVar9 = (double)iVar11;
        dVar24 = local_180 / dVar9;
        auVar25._8_2_ = SUB82(dVar9,0);
        auVar25._0_8_ = dVar9;
        auVar25._10_2_ = (short)((ulong)dVar9 >> 0x10);
        auVar25._12_2_ = (short)((ulong)dVar9 >> 0x20);
        auVar25._14_2_ = (short)((ulong)dVar9 >> 0x30);
        auVar25 = divpd(local_138._0_16_,auVar25);
        if ((((local_168 / dVar9 -
              (auVar25._8_8_ * auVar25._8_8_ + dVar24 * dVar24 + auVar25._0_8_ * auVar25._0_8_)) *
             dVar9) / (double)(iVar11 + -1)) / dVar9 < local_f8) break;
      } while (iVar11 < 99);
      local_138._0_16_ = auVar25;
      local_98._0_8_ = dVar24;
      local_98._8_16_ = auVar25;
      clip((Vector *)local_98);
      iVar11 = (int)(local_138._0_8_ * 255.0);
      cVar16 = (char)((uint)iVar11 >> 0x10);
      iVar10 = (int)(local_138._8_8_ * 255.0);
      cVar19 = (char)iVar10;
      uVar13 = (undefined1)((uint)iVar10 >> 8);
      cVar22 = (char)((uint)iVar10 >> 0x10);
      uVar15 = (undefined1)((uint)iVar10 >> 0x18);
      uVar5 = CONCAT15(uVar13,CONCAT14(cVar19,iVar11));
      sVar1 = (short)iVar11;
      sVar2 = (short)((uint)iVar11 >> 0x10);
      sVar3 = (short)((uint6)uVar5 >> 0x20);
      sVar4 = (short)(CONCAT17(uVar15,CONCAT16(cVar22,uVar5)) >> 0x30);
      uVar6 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * cVar22 - (0xff < sVar4),
                       (0 < sVar3) * (sVar3 < 0x100) * cVar19 - (0xff < sVar3));
      (**(code **)(*local_160 + 0x18))
                (CONCAT17(uVar15,CONCAT16(cVar22,CONCAT15(uVar13,CONCAT14(cVar19,CONCAT13(uVar17,
                                                  CONCAT12(cVar16,CONCAT11(uVar14,(char)iVar11))))))
                         ),uVar6,local_160,
                 (int)(dVar24 * 255.0) & 0xffU |
                 (uint)uVar6 << 0x10 |
                 (uint)CONCAT11((0 < sVar2) * (sVar2 < 0x100) * cVar16 - (0xff < sVar2),
                                (0 < sVar1) * (sVar1 < 0x100) * (char)iVar11 - (0xff < sVar1)) << 8)
      ;
      iVar11 = local_154 + 1;
      local_170 = local_170 + (double)local_b8._0_8_;
    }
    iVar12 = iVar12 + 1;
    local_178 = local_178 - local_120;
    uVar13 = SUB81(local_108,0);
    uVar14 = (undefined1)((ulong)local_108 >> 8);
    uVar15 = (undefined1)((ulong)local_108 >> 0x10);
    uVar17 = (undefined1)((ulong)local_108 >> 0x18);
    uVar18 = (undefined1)((ulong)local_108 >> 0x20);
    uVar20 = (undefined1)((ulong)local_108 >> 0x28);
    uVar21 = (undefined1)((ulong)local_108 >> 0x30);
    uVar23 = (undefined1)((ulong)local_108 >> 0x38);
  } while( true );
}

Assistant:

void adaptive_distributed_render_scene(
   Scene* scene,
   double HalfWidth,double HalfHeight,
   int   nx,int ny,int nxSub,int nySub,
   double Variance,
   char const*PicFileName)
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * HalfWidth / nx;   // pixel width
   double hy = 2.0   * HalfHeight / ny;     // pixel height
   double hxSub = hx /  nxSub;
   double hySub = hy /  nySub;
   double Disp;               // dispersion squared
   int   i,j;
   Vector Color;
   Vector Sum;
   Vector Mean;
   int   Count;

   auto tga = std::make_unique<TargaImage>(PicFileName, nx, ny);
   rgb   c;

   for(i = 0, y = HalfHeight; i < ny; i++, y -= hy)
   {
      for(j = 0, x = -HalfWidth; j < nx; j++, x += hx)
      {
         double x1 = x - 0.5 * hx;
         double y1 = y - 0.5 * hy;
         double d;

         Sum   = 0;
         Disp  = 0;
         Count = 0;

         TotalPixels++;

         do {
            for(int  iSub = 0; iSub < nxSub; iSub++)
            {
               for(int  jSub = 0; jSub < nySub; jSub++)
               {
                  scene->camera(x1+hxSub*(iSub+rnd()),y1+hySub*(jSub+rnd()),ray);
                  Color = scene->trace( Grayzer::Medium::air, 1.0, ray );
                  Sum  += Color;
                  Disp += Color & Color;
                  Count++;
               }
            }
            Mean = Sum / Count;
            d =   (Disp /  Count -  (Mean &  Mean)) * Count / (Count - 1);
         } while(d / Count >= Variance && Count < 99);

         clip( Mean );
         c.r   = Mean.x * 255;
         c.g   = Mean.y * 255;
         c.b   = Mean.z * 255;

         tga->put_pixel(c);
      }
   }
}